

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::VertexBuffersTest::PrepareVAO
          (VertexBuffersTest *this,bool use_multiple_buffers_function)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestContext *pTVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  Enum<int,_2UL> EVar10;
  Enum<int,_2UL> local_898;
  MessageBuilder local_888;
  int local_704;
  GetNameFunc p_Stack_700;
  GLenum error_4;
  int local_6f8;
  Enum<int,_2UL> local_6f0;
  MessageBuilder local_6e0;
  int local_560;
  undefined4 local_55c;
  GLenum error_3;
  GLsizei stride;
  GLintptr offset;
  GLint array_data_1 [2];
  Enum<int,_2UL> local_538;
  MessageBuilder local_528;
  int local_3a4;
  GetNameFunc p_Stack_3a0;
  GLenum error_2;
  int local_398;
  Enum<int,_2UL> local_390;
  MessageBuilder local_380;
  int local_1fc;
  GetNameFunc p_Stack_1f8;
  GLenum error_1;
  int local_1f0;
  Enum<int,_2UL> local_1e8 [2];
  MessageBuilder local_1c8;
  int local_44;
  GLuint local_40;
  GLenum error;
  GLuint buffers [2];
  GLint array_data_0 [4];
  Functions *gl;
  bool use_multiple_buffers_function_local;
  VertexBuffersTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar6 + 0x708))(1,&this->m_vao);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glGenVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x5ce);
  (**(code **)(lVar6 + 0xd8))(this->m_vao);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x5d1);
  buffers[0] = 0;
  buffers[1] = 2;
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_bo_array_0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x5d7);
  (**(code **)(lVar6 + 0x40))(0x8892,this->m_bo_array_0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x5da);
  (**(code **)(lVar6 + 0x150))(0x8892,0x10,buffers,0x88e4);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x5dd);
  pcVar1 = *(code **)(lVar6 + 0x1898);
  uVar4 = (**(code **)(lVar6 + 0x780))(this->m_po,"a_0");
  (*pcVar1)(uVar4,0);
  pcVar1 = *(code **)(lVar6 + 0x1898);
  uVar4 = (**(code **)(lVar6 + 0x780))(this->m_po,"a_1");
  (*pcVar1)(uVar4,1);
  pcVar1 = *(code **)(lVar6 + 0x1950);
  uVar4 = (**(code **)(lVar6 + 0x780))(this->m_po,"a_0");
  (*pcVar1)(uVar4,1,0x1404,0);
  pcVar1 = *(code **)(lVar6 + 0x1950);
  uVar4 = (**(code **)(lVar6 + 0x780))(this->m_po,"a_1");
  (*pcVar1)(uVar4,1,0x1404,0);
  if (use_multiple_buffers_function) {
    local_40 = this->m_bo_array_0;
    error = this->m_bo_array_0;
    (**(code **)(lVar6 + 0x1768))(this->m_vao,0,2,&local_40,PrepareVAO::offsets,PrepareVAO::strides)
    ;
    local_44 = (**(code **)(lVar6 + 0x800))();
    if (local_44 != 0) {
      pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar8 = tcu::TestContext::getLog(pTVar7);
      tcu::TestLog::operator<<(&local_1c8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_1c8,
                          (char (*) [53])"VertexArrayVertexBuffers has unexpectedly generated ");
      EVar10 = glu::getErrorStr(local_44);
      p_Stack_1f8 = EVar10.m_getName;
      local_1f0 = EVar10.m_value;
      local_1e8[0].m_getName = p_Stack_1f8;
      local_1e8[0].m_value = local_1f0;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,local_1e8);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [20])"error. Test fails.\n");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c8);
      return false;
    }
    local_44 = 0;
  }
  else {
    (**(code **)(lVar6 + 0x1760))(this->m_vao,0,this->m_bo_array_0,0,8);
    local_1fc = (**(code **)(lVar6 + 0x800))();
    if (local_1fc != 0) {
      pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar8 = tcu::TestContext::getLog(pTVar7);
      tcu::TestLog::operator<<(&local_380,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_380,
                          (char (*) [52])"VertexArrayVertexBuffer has unexpectedly generated ");
      EVar10 = glu::getErrorStr(local_1fc);
      p_Stack_3a0 = EVar10.m_getName;
      local_398 = EVar10.m_value;
      local_390.m_getName = p_Stack_3a0;
      local_390.m_value = local_398;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_390);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [20])"error. Test fails.\n");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_380);
      return false;
    }
    (**(code **)(lVar6 + 0x1760))(this->m_vao,1,this->m_bo_array_0,4,8);
    local_3a4 = (**(code **)(lVar6 + 0x800))();
    if (local_3a4 != 0) {
      pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar8 = tcu::TestContext::getLog(pTVar7);
      tcu::TestLog::operator<<(&local_528,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_528,
                          (char (*) [52])"VertexArrayVertexBuffer has unexpectedly generated ");
      EVar10 = glu::getErrorStr(local_3a4);
      array_data_1 = (GLint  [2])EVar10.m_getName;
      local_538.m_value = EVar10.m_value;
      local_538.m_getName = (GetNameFunc)array_data_1;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_538);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [20])"error. Test fails.\n");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_528);
      return false;
    }
    local_3a4 = 0;
  }
  (**(code **)(lVar6 + 0x610))(0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glEnableVertexAttribArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x616);
  (**(code **)(lVar6 + 0x610))(1);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glEnableVertexAttribArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x619);
  offset = 0x500000004;
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_bo_array_1);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x61f);
  (**(code **)(lVar6 + 0x40))(0x8892,this->m_bo_array_1);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x622);
  (**(code **)(lVar6 + 0x150))(0x8892,8,&offset,0x88e4);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x625);
  pcVar1 = *(code **)(lVar6 + 0x1898);
  uVar4 = (**(code **)(lVar6 + 0x780))(this->m_po,"a_2");
  (*pcVar1)(uVar4,2);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glVertexAttribBinding call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x628);
  pcVar1 = *(code **)(lVar6 + 0x1950);
  uVar4 = (**(code **)(lVar6 + 0x780))(this->m_po,"a_2");
  (*pcVar1)(uVar4,1,0x1404,0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glVertexAttribIFormat call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x62b);
  if (use_multiple_buffers_function) {
    _error_3 = 0;
    local_55c = 4;
    (**(code **)(lVar6 + 0x1768))(this->m_vao,2,1,&this->m_bo_array_1,&error_3,&local_55c);
    local_560 = (**(code **)(lVar6 + 0x800))();
    if (local_560 != 0) {
      pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar8 = tcu::TestContext::getLog(pTVar7);
      tcu::TestLog::operator<<(&local_6e0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_6e0,
                          (char (*) [53])"VertexArrayVertexBuffers has unexpectedly generated ");
      EVar10 = glu::getErrorStr(local_560);
      p_Stack_700 = EVar10.m_getName;
      local_6f8 = EVar10.m_value;
      local_6f0.m_getName = p_Stack_700;
      local_6f0.m_value = local_6f8;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_6f0);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [20])"error. Test fails.\n");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6e0);
      return false;
    }
    local_560 = 0;
  }
  else {
    (**(code **)(lVar6 + 0x1760))(this->m_vao,2,this->m_bo_array_1,0,4);
    local_704 = (**(code **)(lVar6 + 0x800))();
    if (local_704 != 0) {
      pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar8 = tcu::TestContext::getLog(pTVar7);
      tcu::TestLog::operator<<(&local_888,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_888,
                          (char (*) [52])"VertexArrayVertexBuffer has unexpectedly generated ");
      EVar10 = glu::getErrorStr(local_704);
      local_898.m_getName = EVar10.m_getName;
      local_898.m_value = EVar10.m_value;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_898);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [20])"error. Test fails.\n");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_888);
      return false;
    }
    local_704 = 0;
  }
  (**(code **)(lVar6 + 0x610))(2);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glEnableVertexAttribArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x64e);
  (**(code **)(lVar6 + 0xd8))(0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x651);
  return true;
}

Assistant:

bool VertexBuffersTest::PrepareVAO(bool use_multiple_buffers_function)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* VAO creation. */
	gl.genVertexArrays(1, &m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Array buffer 0 creation. */
	glw::GLint array_data_0[4] = { 0, 2, 1, 3 };

	gl.genBuffers(1, &m_bo_array_0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_array_0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(array_data_0), array_data_0, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	gl.vertexAttribBinding(gl.getAttribLocation(m_po, "a_0"), 0);

	gl.vertexAttribBinding(gl.getAttribLocation(m_po, "a_1"), 1);

	gl.vertexAttribIFormat(gl.getAttribLocation(m_po, "a_0"), 1, GL_INT, 0);

	gl.vertexAttribIFormat(gl.getAttribLocation(m_po, "a_1"), 1, GL_INT, 0);

	if (use_multiple_buffers_function)
	{
		const glw::GLuint		   buffers[2] = { m_bo_array_0, m_bo_array_0 };
		static const glw::GLintptr offsets[2] = { (glw::GLintptr)NULL, (glw::GLintptr)((glw::GLint*)NULL + 1) };
		static const glw::GLsizei  strides[2] = { sizeof(glw::GLint) * 2, sizeof(glw::GLint) * 2 };

		gl.vertexArrayVertexBuffers(m_vao, 0, 2, buffers, offsets, strides);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "VertexArrayVertexBuffers has unexpectedly generated "
												<< glu::getErrorStr(error) << "error. Test fails.\n"
												<< tcu::TestLog::EndMessage;

			return false;
		}
	}
	else
	{
		gl.vertexArrayVertexBuffer(m_vao, 0, m_bo_array_0, (glw::GLintptr)NULL, sizeof(glw::GLint) * 2);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "VertexArrayVertexBuffer has unexpectedly generated "
												<< glu::getErrorStr(error) << "error. Test fails.\n"
												<< tcu::TestLog::EndMessage;

			return false;
		}

		gl.vertexArrayVertexBuffer(m_vao, 1, m_bo_array_0, (glw::GLintptr)((glw::GLint*)NULL + 1),
								   sizeof(glw::GLint) * 2);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "VertexArrayVertexBuffer has unexpectedly generated "
												<< glu::getErrorStr(error) << "error. Test fails.\n"
												<< tcu::TestLog::EndMessage;

			return false;
		}
	}

	gl.enableVertexAttribArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.enableVertexAttribArray(1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	/* Array buffer 1 creation. */
	glw::GLint array_data_1[2] = { 4, 5 };

	gl.genBuffers(1, &m_bo_array_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_array_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(array_data_1), array_data_1, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	gl.vertexAttribBinding(gl.getAttribLocation(m_po, "a_2"), 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribBinding call failed.");

	gl.vertexAttribIFormat(gl.getAttribLocation(m_po, "a_2"), 1, GL_INT, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribIFormat call failed.");

	if (use_multiple_buffers_function)
	{
		glw::GLintptr offset = (glw::GLintptr)NULL;
		glw::GLsizei  stride = sizeof(glw::GLint);

		gl.vertexArrayVertexBuffers(m_vao, 2, 1, &m_bo_array_1, &offset, &stride);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "VertexArrayVertexBuffers has unexpectedly generated "
												<< glu::getErrorStr(error) << "error. Test fails.\n"
												<< tcu::TestLog::EndMessage;

			return false;
		}
	}
	else
	{
		gl.vertexArrayVertexBuffer(m_vao, 2, m_bo_array_1, (glw::GLintptr)NULL, sizeof(glw::GLint));

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "VertexArrayVertexBuffer has unexpectedly generated "
												<< glu::getErrorStr(error) << "error. Test fails.\n"
												<< tcu::TestLog::EndMessage;

			return false;
		}
	}

	gl.enableVertexAttribArray(2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.bindVertexArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	return true;
}